

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFilter.cpp
# Opt level: O1

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::ArgumentListParser::parse_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,void *this,istream *is)

{
  char cVar1;
  char *in_RCX;
  string word;
  string local_50;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cVar1 = cali::util::read_char(is);
  if (cVar1 == '(') {
    do {
      cali::util::read_word_abi_cxx11_(&local_50,(util *)is,(istream *)",()",in_RCX);
      if (local_50._M_string_length != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                   __return_storage_ptr__,&local_50);
      }
      cVar1 = cali::util::read_char(is);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    } while (((*(char *)((long)this + 0x20) == '\0') && (cVar1 == ',')) &&
            (*(int *)(is + *(long *)(*(long *)is + -0x18) + 0x20) == 0));
    if (cVar1 != ')') {
      *(undefined1 *)((long)this + 0x20) = 1;
      std::__cxx11::string::_M_replace((ulong)this,0,*(char **)((long)this + 8),0x22e635);
    }
  }
  else {
    std::istream::unget();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> parse(std::istream& is)
    {
        std::vector<std::string> ret;
        char                     c = util::read_char(is);

        if (c != '(') {
            is.unget();
            return ret;
        }

        do {
            std::string word = util::read_word(is, ",()");

            if (!word.empty())
                ret.emplace_back(std::move(word));

            c = util::read_char(is);
        } while (!m_error && is.good() && c == ',');

        if (c != ')') {
            m_error     = true;
            m_error_msg = "missing \')\'";
        }

        return ret;
    }